

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O2

void reportLpDimensions(HighsLogOptions *log_options,HighsLp *lp)

{
  uint uVar1;
  long lVar2;
  char *format;
  uint uVar3;
  ulong uVar4;
  
  lVar2 = (long)lp->num_col_;
  if (lVar2 == 0) {
    uVar3 = 0;
  }
  else {
    uVar3 = (lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[lVar2];
  }
  highsLogUser(log_options,kInfo,"LP has %d columns, %d rows",lVar2,(ulong)(uint)lp->num_row_);
  uVar1 = getNumInt(lp);
  if (uVar1 == 0) {
    format = " and %d nonzeros\n";
    uVar4 = 0;
  }
  else {
    format = ", %d nonzeros and %d integer columns\n";
    uVar4 = (ulong)uVar1;
  }
  highsLogUser(log_options,kInfo,format,(ulong)uVar3,uVar4);
  return;
}

Assistant:

void reportLpDimensions(const HighsLogOptions& log_options, const HighsLp& lp) {
  HighsInt lp_num_nz;
  if (lp.num_col_ == 0)
    lp_num_nz = 0;
  else
    lp_num_nz = lp.a_matrix_.start_[lp.num_col_];
  highsLogUser(log_options, HighsLogType::kInfo,
               "LP has %" HIGHSINT_FORMAT " columns, %" HIGHSINT_FORMAT " rows",
               lp.num_col_, lp.num_row_);
  HighsInt num_int = getNumInt(lp);
  if (num_int) {
    highsLogUser(log_options, HighsLogType::kInfo,
                 ", %" HIGHSINT_FORMAT " nonzeros and %" HIGHSINT_FORMAT
                 " integer columns\n",
                 lp_num_nz, num_int);
  } else {
    highsLogUser(log_options, HighsLogType::kInfo,
                 " and %" HIGHSINT_FORMAT " nonzeros\n", lp_num_nz, num_int);
  }
}